

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_stalactites(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  ROOM_AFFECT_DATA *in_RDX;
  undefined2 in_SI;
  ROOM_AFFECT_DATA raf;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  CHAR_DATA *in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa2;
  undefined2 uVar2;
  undefined2 in_stack_ffffffffffffffa4;
  short sVar3;
  undefined2 in_stack_ffffffffffffffa6;
  
  bVar1 = is_outside(in_stack_ffffffffffffff98);
  if (bVar1) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffffa6,
                                  CONCAT24(in_stack_ffffffffffffffa4,
                                           CONCAT22(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0))),
                 in_stack_ffffffffffffff98);
  }
  else {
    bVar1 = is_affected_room((ROOM_INDEX_DATA *)in_RDX[2].owner,(int)gsn_stalactites);
    if (bVar1) {
      send_to_char((char *)CONCAT26(in_stack_ffffffffffffffa6,
                                    CONCAT24(in_stack_ffffffffffffffa4,
                                             CONCAT22(in_stack_ffffffffffffffa2,
                                                      in_stack_ffffffffffffffa0))),
                   in_stack_ffffffffffffff98);
    }
    else {
      act((char *)CONCAT26(in_stack_ffffffffffffffa6,
                           CONCAT24(in_stack_ffffffffffffffa4,
                                    CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))),
          in_stack_ffffffffffffff98,
          (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
          (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
      act((char *)CONCAT26(in_stack_ffffffffffffffa6,
                           CONCAT24(in_stack_ffffffffffffffa4,
                                    CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))),
          in_stack_ffffffffffffff98,
          (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
          (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
      init_affect_room((ROOM_AFFECT_DATA *)0x6e624b);
      uVar2 = 0;
      sVar3 = gsn_stalactites;
      dice(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      new_affect_to_room((ROOM_INDEX_DATA *)
                         CONCAT26(in_SI,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffffa0))),
                         in_RDX);
    }
  }
  return;
}

Assistant:

void spell_stalactites(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	ROOM_AFFECT_DATA raf;

	if (is_outside(ch))
	{
		send_to_char("You must be indoors to cast this spell.\n\r", ch);
		return;
	}

	if (is_affected_room(ch->in_room, gsn_stalactites))
	{
		send_to_char("There are already stalactites hanging here.\n\r", ch);
		return;
	}

	act("You cause razor-sharp stalactites to sprout from the ceiling above.", ch, 0, 0, TO_CHAR);
	act("$n raises one arm and icy stalactites form on the ceiling above.", ch, 0, 0, TO_ROOM);

	init_affect_room(&raf);
	raf.where = TO_ROOM_AFFECTS;
	raf.aftype = AFT_SPELL;
	raf.type = gsn_stalactites;
	raf.level = level;
	raf.location = 0;
	raf.modifier = dice(1, 6);
	raf.duration = level / 5;
	raf.owner = ch;
	raf.end_fun = nullptr;
	raf.tick_fun = nullptr;
	new_affect_to_room(ch->in_room, &raf);
}